

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

void doaltarobj(obj *obj)

{
  obj *poVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  obj *local_48;
  obj *local_40;
  obj *local_38;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016bc5d;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016bc54;
  }
  else {
LAB_0016bc54:
    if (ublindf == (obj *)0x0) {
      return;
    }
LAB_0016bc5d:
    if (ublindf->oartifact != '\x1d') {
      return;
    }
  }
  u.uconduct.gnostic = u.uconduct.gnostic + 1;
  if (((*(uint *)&obj->field_0x4a & 3) == 0) || (obj->oclass == '\f')) {
    pcVar5 = Doname2(obj);
    pcVar6 = otense(obj,"land");
    pline("%s %s on the altar.",pcVar5,pcVar6);
  }
  else {
    pcVar5 = "amber";
    if ((*(uint *)&obj->field_0x4a & 2) == 0) {
      pcVar5 = "black";
    }
    pcVar5 = hcolor(pcVar5);
    pcVar5 = an(pcVar5);
    pcVar6 = doname(obj);
    pcVar7 = otense(obj,"hit");
    pline("There is %s flash as %s %s the altar.",pcVar5,pcVar6,pcVar7);
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0'))))
    goto LAB_0016bcd1;
  }
  obj->field_0x4a = obj->field_0x4a | 0x40;
LAB_0016bcd1:
  if (obj->cobj != (obj *)0x0) {
    iVar8 = 0;
    poVar1 = obj->cobj;
    local_40 = obj;
LAB_0016bcf2:
    local_48 = poVar1;
    if (local_48 != (obj *)0x0) {
      poVar1 = local_48->nobj;
      uVar3 = *(uint *)&local_48->field_0x4a;
      iVar8 = (iVar8 + 1) - (uint)((uVar3 & 3) == 0);
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) goto code_r0x0016bd27;
      goto LAB_0016bd5d;
    }
    if (iVar8 != 0) {
      if (iVar8 == 1) {
        pcVar5 = "Looking inside %s, you see a colored flash.";
      }
      else {
        pcVar5 = "Looking inside %s, you see colored flashes.";
      }
      pcVar6 = xname(local_40);
      pcVar6 = the(pcVar6);
      pline(pcVar5,pcVar6);
    }
  }
  return;
code_r0x0016bd27:
  if ((u.umonnum != u.umonster) && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')) {
    uVar3 = *(uint *)&local_48->field_0x4a;
LAB_0016bd5d:
    *(uint *)&local_48->field_0x4a = uVar3 | 0x40;
    local_38 = (obj *)&obj->cobj;
    do {
      local_38 = local_38->nobj;
      if (local_38 == (obj *)0x0) break;
    } while ((local_38 == local_48) || (iVar4 = merged(&local_38,&local_48), iVar4 == 0));
  }
  goto LAB_0016bcf2;
}

Assistant:

void doaltarobj(struct obj *obj)  /* obj is an object dropped on an altar */
{
	if (Blind)
		return;

	/* KMH, conduct */
	u.uconduct.gnostic++;

	if ((obj->blessed || obj->cursed) && obj->oclass != COIN_CLASS) {
		pline("There is %s flash as %s %s the altar.",
			an(hcolor(obj->blessed ? "amber" : "black")),
			doname(obj), otense(obj, "hit"));
		if (!Hallucination) obj->bknown = 1;
	} else {
		pline("%s %s on the altar.", Doname2(obj),
			otense(obj, "land"));
		obj->bknown = 1;
	}

	/* Also BUC one level deep inside containers. */
	if (Has_contents(obj)) {
	    struct obj *otmp, *otmp2, *otmp_nobj;
	    int buccount = 0;
	    for (otmp = obj->cobj; otmp; ) {
		/* Ensure next otmp in case otmp is merged
		 * and thus freed and unusable. */
		otmp_nobj = otmp->nobj;
		if (otmp->blessed || otmp->cursed)
		    buccount++;
		if (!Hallucination) {
		    otmp->bknown = 1;
		    /* Merge obj with a contained object if possible,
		     * so objects of the same BUC but different BUC-known state
		     * don't form separate stacks in the container. */
		    for (otmp2 = obj->cobj; otmp2; otmp2 = otmp2->nobj)
			if (otmp2 != otmp && merged(&otmp2, &otmp))
			    break;
		}
		otmp = otmp_nobj;
	    }
	    if (buccount == 1) {
		pline("Looking inside %s, you see a colored flash.",
		      the(xname(obj)));
	    } else if (buccount > 1) {
		pline("Looking inside %s, you see colored flashes.",
		      the(xname(obj)));
	    }
	}
}